

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::SourceBreakpoint>::construct
          (BasicTypeInfo<dap::SourceBreakpoint> *this,void *ptr)

{
  memset(ptr,0,0x90);
  SourceBreakpoint::SourceBreakpoint((SourceBreakpoint *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }